

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void predict_and_reconstruct_intra_block
               (AV1_COMMON *cm,DecoderCodingBlock *dcb,aom_reader *r,int plane,int row,int col,
               TX_SIZE tx_size)

{
  int stride;
  MB_MODE_INFO *pMVar1;
  TX_TYPE tx_type;
  CFL_ALLOWED_TYPE CVar2;
  uint reduced_tx_set;
  
  pMVar1 = *(dcb->xd).mi;
  av1_predict_intra_block_facade(cm,&dcb->xd,plane,col,row,tx_size);
  if ((pMVar1->skip_txfm == '\0') && (dcb->eob_data[plane][dcb->txb_offset[plane]].eob != 0)) {
    reduced_tx_set = (uint)(cm->features).reduced_tx_set_used;
    tx_type = av1_get_tx_type(&dcb->xd,plane != 0,row,col,tx_size,reduced_tx_set);
    stride = (dcb->xd).plane[plane].dst.stride;
    inverse_transform_block
              (dcb,plane,tx_type,tx_size,(dcb->xd).plane[plane].dst.buf + (stride * row + col) * 4,
               stride,reduced_tx_set);
  }
  if (plane == 0) {
    CVar2 = store_cfl_required(cm,&dcb->xd);
    if (CVar2 != '\0') {
      cfl_store_tx(&dcb->xd,row,col,tx_size,pMVar1->bsize);
      return;
    }
  }
  return;
}

Assistant:

static inline void predict_and_reconstruct_intra_block(
    const AV1_COMMON *const cm, DecoderCodingBlock *dcb, aom_reader *const r,
    const int plane, const int row, const int col, const TX_SIZE tx_size) {
  (void)r;
  MACROBLOCKD *const xd = &dcb->xd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  PLANE_TYPE plane_type = get_plane_type(plane);

  av1_predict_intra_block_facade(cm, xd, plane, col, row, tx_size);

  if (!mbmi->skip_txfm) {
    eob_info *eob_data = dcb->eob_data[plane] + dcb->txb_offset[plane];
    if (eob_data->eob) {
      const bool reduced_tx_set_used = cm->features.reduced_tx_set_used;
      // tx_type was read out in av1_read_coeffs_txb.
      const TX_TYPE tx_type = av1_get_tx_type(xd, plane_type, row, col, tx_size,
                                              reduced_tx_set_used);
      struct macroblockd_plane *const pd = &xd->plane[plane];
      uint8_t *dst = &pd->dst.buf[(row * pd->dst.stride + col) << MI_SIZE_LOG2];
      inverse_transform_block(dcb, plane, tx_type, tx_size, dst, pd->dst.stride,
                              reduced_tx_set_used);
    }
  }
  if (plane == AOM_PLANE_Y && store_cfl_required(cm, xd)) {
    cfl_store_tx(xd, row, col, tx_size, mbmi->bsize);
  }
}